

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_decl.h
# Opt level: O0

uint32_t google::protobuf::internal::TcParseTableBase::TagToIdx
                   (uint32_t tag,uint32_t fast_table_size)

{
  char *failure_msg;
  LogMessage *pLVar1;
  uint32_t idx_mask;
  LogMessage local_38;
  Voidify local_21;
  uint local_20;
  uint local_1c;
  Nullable<const_char_*> local_18;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  uint32_t fast_table_size_local;
  uint32_t tag_local;
  
  absl_log_internal_check_op_result._0_4_ = fast_table_size;
  absl_log_internal_check_op_result._4_4_ = tag;
  local_1c = absl::lts_20250127::log_internal::GetReferenceableValue
                       (fast_table_size & fast_table_size - 1);
  local_20 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_18 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_int,unsigned_int>
                       (&local_1c,&local_20,
                        "(fast_table_size & (fast_table_size - 1)) == uint32_t{0}");
  if (local_18 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_18);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_decl.h"
               ,0x18a,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  return absl_log_internal_check_op_result._4_4_ >> 3 &
         (uint32_t)absl_log_internal_check_op_result - 1;
}

Assistant:

static uint32_t TagToIdx(uint32_t tag, uint32_t fast_table_size) {
    // The fast table size must be a power of two.
    ABSL_DCHECK_EQ((fast_table_size & (fast_table_size - 1)), uint32_t{0});

    // The field index is determined by the low bits of the field number, where
    // the table size determines the width of the mask. The largest table
    // supported is 32 entries. The parse loop uses these bits directly, so that
    // the dispatch does not require arithmetic:
    //        byte 0   byte 1
    //   tag: 1nnnnttt 0nnnnnnn
    //        ^^^^^
    //         idx (table_size_log2=5)
    // This means that any field number that does not fit in the lower 4 bits
    // will always have the top bit of its table index asserted.
    uint32_t idx_mask = fast_table_size - 1;
    return (tag >> 3) & idx_mask;
  }